

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O2

void __thiscall CCNR::Mersenne::seed(Mersenne *this,int se)

{
  int iVar1;
  
  this->mt[0] = se * 2 + 1;
  iVar1 = 1;
  while( true ) {
    this->mti = iVar1;
    if (0x26f < iVar1) break;
    this->mt[iVar1] =
         (this->mt[(long)iVar1 + -1] >> 0x1e ^ this->mt[(long)iVar1 + -1]) * 0x6c078965 + iVar1;
    iVar1 = this->mti + 1;
  }
  return;
}

Assistant:

void Mersenne::seed(int se)
{
    unsigned int s = ((unsigned int)(se << 1)) + 1;
    // Seeds should not be zero. Other possible solutions (such as s |= 1)
    // lead to more confusion, because often-used low seeds like 2 and 3 would
    // be identical. This leads to collisions only for rarely used seeds (see
    // note in header file).
    mt[0] = s & 0xffffffffUL;
    for (mti = 1; mti < N; mti++) {
        mt[mti] = (1812433253UL * (mt[mti - 1] ^ (mt[mti - 1] >> 30)) + mti);
        mt[mti] &= 0xffffffffUL;
    }
}